

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

int cmdParse(char *buf,uint32_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uint32_t *val;
  uint32_t *val_00;
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  __int32_t **pp_Var8;
  void *pvVar9;
  size_t sVar10;
  int i;
  ulong uVar11;
  long lVar12;
  char **ppcVar13;
  byte bVar15;
  char *pcVar14;
  bool bVar16;
  int n;
  uint32_t tp1;
  int n2;
  int8_t to3;
  int8_t to5;
  int8_t to4;
  uint32_t tp3;
  uint32_t tp2;
  uint32_t tp5;
  uint32_t tp4;
  int pp;
  uint32_t local_78;
  uint32_t local_74;
  char *local_70;
  uint32_t local_68;
  char local_61;
  uint *local_60;
  char local_52;
  char local_51;
  uint32_t *local_50;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_38;
  int local_34;
  
  local_74 = 0;
  local_40 = 0;
  local_44 = 0;
  local_38 = 0;
  local_3c = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  uVar11 = 0;
  local_70 = buf;
  local_60 = (uint *)ext;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&local_34);
  ctl->eaten = ctl->eaten + local_34;
  *p = 0xffffffff;
  ppcVar13 = &cmdInfo[0].name;
  do {
    iVar5 = strcasecmp(intCmdStr,*ppcVar13);
    pcVar3 = local_70;
    if (iVar5 == 0) goto LAB_0012590e;
    uVar11 = uVar11 + 1;
    ppcVar13 = ppcVar13 + 3;
  } while (uVar11 != 0xa8);
  uVar11 = 0xffffffff;
LAB_0012590e:
  iVar5 = (int)uVar11;
  if (iVar5 < 0) {
    return iVar5;
  }
  *p = cmdInfo[uVar11 & 0xffffffff].cmd;
  val = p + 1;
  p[1] = 0;
  p[2] = 0;
  val_00 = p + 2;
  p[3] = 0;
  bVar16 = true;
  local_50 = val_00;
  switch(cmdInfo[uVar11 & 0xffffffff].vt) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    goto switchD_0012595a_caseD_66;
  case 0x6f:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    cVar1 = ctl->opt[1];
    goto LAB_001260e4;
  case 0x70:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    cVar1 = ctl->opt[1];
    goto joined_r0x0012616e;
  case 0x71:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') goto switchD_0012595a_caseD_66;
    uVar2 = *val;
    goto LAB_00126252;
  case 0x72:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    bVar16 = ctl->opt[1] != '\x01';
    goto switchD_0012595a_caseD_66;
  case 0x73:
    sVar10 = strlen(local_70 + ctl->eaten);
    p[3] = (uint32_t)sVar10;
    memcpy(local_60,pcVar3 + ctl->eaten,sVar10 & 0xffffffff);
    local_68 = p[3];
    goto LAB_001262bd;
  case 0x74:
    iVar6 = __isoc99_sscanf(local_70 + ctl->eaten," %*s%n %n",&local_78,&local_68);
    bVar16 = true;
    if (local_78 == 0 || iVar6 < 0) goto switchD_0012595a_caseD_66;
    p[3] = local_78;
    ctl->opt[3] = '\x01';
    memcpy(local_60,local_70 + ctl->eaten,(long)(int)local_78);
LAB_001262bd:
    ctl->eaten = ctl->eaten + local_68;
    break;
  case 0x79:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') goto LAB_001266ac;
    bVar16 = true;
    if (((int)*val < 0) || (ctl->opt[2] < '\x01')) goto switchD_0012595a_caseD_66;
    bVar15 = (byte)(*val_00 >> 0x18);
    goto LAB_001261de;
  case 0x7a:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') goto LAB_001266ac;
    bVar16 = true;
    if ((int)*val < 0) goto switchD_0012595a_caseD_66;
LAB_001260e0:
    cVar1 = ctl->opt[2];
LAB_001260e4:
    bVar16 = cVar1 < '\x01';
    goto switchD_0012595a_caseD_66;
  case 0x7b:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if ('\0' < ctl->opt[1]) {
      bVar16 = true;
      if (0x95 < *val) goto switchD_0012595a_caseD_66;
      goto LAB_001260e0;
    }
    goto LAB_001266ac;
  case 0x7c:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') goto LAB_001266ac;
    bVar16 = true;
    if ((0x95 < *val) || (ctl->opt[2] < '\x01')) goto switchD_0012595a_caseD_66;
    uVar2 = *val_00;
LAB_00126252:
    bVar16 = 0x95 < uVar2;
    goto switchD_0012595a_caseD_66;
  case 0x7d:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = __isoc99_sscanf(pcVar3 + lVar12," %c %n",&local_68,&local_78);
    if (((ctl->opt[1] < '\x01') || (iVar6 < 1)) || ((int)*val < 0)) goto switchD_0012595a_caseD_66;
    ctl->eaten = ctl->eaten + local_78;
    pp_Var8 = __ctype_toupper_loc();
    pvVar9 = memchr("RW540123",(*pp_Var8)[(char)local_68],9);
    if (pvVar9 == (void *)0x0) goto switchD_0012595a_caseD_66;
    iVar6 = 0x12c8aa;
    goto LAB_00125f0c;
  case 0x7e:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = __isoc99_sscanf(pcVar3 + lVar12," %c %n",&local_68,&local_78);
    if (((ctl->opt[1] < '\x01') || (iVar6 < 1)) || ((int)*val < 0)) goto switchD_0012595a_caseD_66;
    ctl->eaten = ctl->eaten + local_78;
    pp_Var8 = __ctype_toupper_loc();
    pvVar9 = memchr("ODU",(*pp_Var8)[(char)local_68],4);
    if (pvVar9 == (void *)0x0) goto switchD_0012595a_caseD_66;
    iVar6 = 0x12c8b3;
LAB_00125f0c:
    *val_00 = (int)pvVar9 - iVar6;
    break;
  case 0x7f:
    iVar6 = __isoc99_sscanf(local_70 + ctl->eaten," %*s%n %n",&local_78,&local_68);
    if (local_78 == 0 || iVar6 < 0) goto LAB_001266ac;
    p[3] = local_78;
    ctl->opt[2] = '\x01';
    memcpy(local_60,pcVar3 + ctl->eaten,(long)(int)local_78);
    lVar12 = (long)ctl->eaten + (long)(int)local_68;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar6;
    cVar1 = ctl->opt[1];
joined_r0x0012616e:
    bVar16 = true;
    if ('\0' < cVar1) {
      bVar15 = (byte)(*val >> 0x18);
LAB_001261de:
      bVar16 = (bool)(bVar15 >> 7);
    }
    goto switchD_0012595a_caseD_66;
  case 0x80:
    iVar6 = __isoc99_sscanf(local_70 + ctl->eaten," %*s%n %n",&local_78,&local_68);
    puVar4 = local_60;
    pcVar3 = local_70;
    bVar16 = true;
    if (local_78 == 0 || iVar6 < 0) goto switchD_0012595a_caseD_66;
    local_50 = (uint32_t *)(long)(int)local_78;
    p[1] = local_78;
    memcpy(local_60,local_70 + ctl->eaten,(size_t)local_50);
    ctl->eaten = ctl->eaten + local_78;
    pcVar14 = (char *)((long)puVar4 + (long)local_50);
    *pcVar14 = '\0';
    iVar6 = ctl->eaten;
    sVar10 = strlen(pcVar3 + (long)iVar6 + 1);
    uVar7 = (uint32_t)sVar10;
    local_68 = uVar7;
    memcpy(pcVar14 + 1,pcVar3 + (long)iVar6 + 1,(long)(int)uVar7);
    ctl->eaten = ctl->eaten + uVar7 + 1;
    p[3] = uVar7 + 1 + p[1];
    break;
  case 0x83:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_74,ctl->opt + 3);
    ctl->eaten = ctl->eaten + iVar6;
    if (((ctl->opt[1] < '\x01') || ((int)*val < 0)) ||
       ((ctl->opt[2] < '\x01' || ((int)*local_50 < 0)))) goto LAB_001266ac;
    bVar16 = true;
    if ((int)local_74 < 0 || ctl->opt[3] < '\x01') goto switchD_0012595a_caseD_66;
LAB_00125fc7:
    p[3] = 4;
    *local_60 = local_74;
    break;
  case 0x84:
    iVar6 = __isoc99_sscanf(local_70 + ctl->eaten," %*s%n %n",&local_78,&local_68);
    if (local_78 != 0 && -1 < iVar6) {
      p[3] = local_78;
      ctl->opt[2] = '\x01';
      memcpy(local_60,pcVar3 + ctl->eaten,(long)(int)local_78);
      lVar12 = (long)ctl->eaten + (long)(int)local_68;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,val,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,local_50,ctl->opt + 2);
      ctl->eaten = ctl->eaten + iVar6;
      bVar16 = true;
      if (((ctl->opt[1] < '\x01') || ((int)*val < 0)) || (ctl->opt[2] < '\x01'))
      goto switchD_0012595a_caseD_66;
      bVar15 = (byte)(*local_50 >> 0x18);
      goto LAB_001261de;
    }
    goto LAB_001266ac;
  case 0x85:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,local_50,ctl->opt + 2);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_74,(int8_t *)&local_78);
    ctl->eaten = ctl->eaten + iVar6;
    if ('\0' < ctl->opt[1]) {
      bVar16 = true;
      if (((int)*val < 0) ||
         (((int)local_74 < 0 || (char)local_78 != '\x01') || ctl->opt[2] < '\x01'))
      goto switchD_0012595a_caseD_66;
      goto LAB_00125fc7;
    }
LAB_001266ac:
    bVar16 = true;
    goto switchD_0012595a_caseD_66;
  case 0x86:
    iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_74,(int8_t *)&local_78);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_40,(int8_t *)&local_68);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_44,&local_61);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_38,&local_51);
    lVar12 = (long)iVar6 + (long)ctl->eaten;
    ctl->eaten = (int)lVar12;
    iVar6 = getNum(pcVar3 + lVar12,&local_3c,&local_52);
    ctl->eaten = ctl->eaten + iVar6;
    if (ctl->opt[1] < '\x01') goto LAB_001266ac;
    bVar16 = true;
    if (((((((int)*val < 0) || ((char)local_78 != '\x01')) || ((int)local_74 < 0)) ||
         ((((char)local_68 != '\x01' || ((int)local_40 < 0)) ||
          ((local_61 != '\x01' || (((int)local_44 < 0 || (local_51 != '\x01')))))))) ||
        ((int)local_38 < 0)) || (local_52 != '\x01')) goto switchD_0012595a_caseD_66;
    p[3] = 0x14;
    *local_60 = local_74;
    local_60[1] = local_40;
    local_60[2] = local_44;
    local_60[3] = local_38;
    local_60[4] = local_3c;
    break;
  default:
    switch(cmdInfo[uVar11 & 0xffffffff].vt) {
    case 0xbf:
      iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
      pcVar3 = local_70;
      ctl->eaten = ctl->eaten + iVar6;
      if ((ctl->opt[1] != '\x01') || ((int)*val < 0)) goto switchD_0012595a_caseD_66;
      lVar12 = 0;
      do {
        iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
        ctl->eaten = ctl->eaten + iVar6;
        if ((char)local_78 != '\x01') goto LAB_00125a0d;
        local_60[lVar12] = local_74;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 10);
      lVar12 = 10;
LAB_00125a0d:
      uVar11 = (ulong)(uint)((int)lVar12 << 2);
LAB_00125a11:
      p[3] = (uint32_t)uVar11;
      break;
    case 0xc0:
      lVar12 = 0;
      do {
        iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
        ctl->eaten = ctl->eaten + iVar6;
        if ((char)local_78 != '\x01') goto LAB_0012652b;
        local_60[lVar12] = local_74;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x200);
      lVar12 = 0x200;
LAB_0012652b:
      iVar6 = (int)lVar12;
      p[3] = iVar6 * 4;
      bVar16 = 0x55555555 < (uint)(iVar6 * -0x55555555) || iVar6 == 0;
      goto switchD_0012595a_caseD_66;
    case 0xc1:
      iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
      ctl->eaten = ctl->eaten + iVar6;
      if ((ctl->opt[1] != '\x01') || ((int)*val < 0)) goto switchD_0012595a_caseD_66;
      lVar12 = 0;
      do {
        iVar6 = getNum(local_70 + ctl->eaten,&local_74,(int8_t *)&local_78);
        if (((char)local_78 != '\x01') || (0xff < local_74)) goto LAB_001263ff;
        *(char *)((long)local_60 + lVar12) = (char)local_74;
        lVar12 = lVar12 + 1;
        ctl->eaten = ctl->eaten + iVar6;
      } while ((int)lVar12 != 0x200);
      lVar12 = 0x200;
LAB_001263ff:
      p[3] = (uint32_t)lVar12;
      bVar16 = true;
      if (((uint32_t)lVar12 == 0) && (*p != 0x72)) goto switchD_0012595a_caseD_66;
      break;
    case 0xc2:
      iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
      pcVar3 = local_70;
      ctl->eaten = ctl->eaten + iVar6;
      if ((ctl->opt[1] != '\x01') || (ctl->opt[2] != '\x01')) goto LAB_001266ac;
      bVar16 = true;
      if (((int)*val < 0) || (0xff < *local_50)) goto switchD_0012595a_caseD_66;
      lVar12 = 0;
      do {
        iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
        if (((char)local_78 != '\x01') || (0xff < local_74)) goto LAB_00126719;
        *(char *)((long)local_60 + lVar12) = (char)local_74;
        lVar12 = lVar12 + 1;
        ctl->eaten = ctl->eaten + iVar6;
      } while ((int)lVar12 != 0x20);
      lVar12 = 0x20;
      goto LAB_00126719;
    case 0xc3:
      iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      if (ctl->opt[1] == '\x01') {
        if ((int)*val < 0) goto LAB_001266ac;
        iVar6 = getNum(local_70 + lVar12,val_00,ctl->opt + 2);
        pcVar3 = local_70;
        ctl->eaten = ctl->eaten + iVar6;
        if (ctl->opt[2] == '\x01') {
          bVar16 = true;
          if ((int)*val_00 < 0) goto switchD_0012595a_caseD_66;
          uVar11 = 0;
          do {
            iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
            if (((char)local_78 != '\x01') || (0xff < local_74)) goto LAB_00125a11;
            *(char *)((long)local_60 + uVar11) = (char)local_74;
            uVar11 = uVar11 + 1;
            ctl->eaten = ctl->eaten + iVar6;
          } while ((int)uVar11 != 0x200);
          uVar11 = 0x200;
          goto LAB_00125a11;
        }
      }
      break;
    case 0xc4:
      iVar6 = getNum(local_70 + ctl->eaten,val,ctl->opt + 1);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,val_00,ctl->opt + 2);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,&local_74,(int8_t *)&local_78);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,&local_40,(int8_t *)&local_68);
      lVar12 = (long)iVar6 + (long)ctl->eaten;
      ctl->eaten = (int)lVar12;
      iVar6 = getNum(pcVar3 + lVar12,&local_44,&local_61);
      pcVar3 = local_70;
      ctl->eaten = ctl->eaten + iVar6;
      if (ctl->opt[1] != '\x01') goto LAB_001266ac;
      bVar16 = true;
      if ((((((int)*val < 0) || (ctl->opt[2] != '\x01')) || ((int)*local_50 < 1)) ||
          (((char)local_78 != '\x01' || ((char)local_68 != '\x01')))) || (local_61 != '\x01'))
      goto switchD_0012595a_caseD_66;
      *local_60 = local_74;
      local_60[1] = local_40;
      local_60[2] = local_44;
      lVar12 = 0;
      do {
        iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
        if (((char)local_78 != '\x01') || (0xff < local_74)) goto LAB_001266a2;
        *(char *)((long)local_60 + lVar12 + 0xc) = (char)local_74;
        lVar12 = lVar12 + 1;
        ctl->eaten = ctl->eaten + iVar6;
      } while ((int)lVar12 != 0x200);
      lVar12 = 0x200;
LAB_001266a2:
      uVar7 = (uint32_t)lVar12;
      p[3] = uVar7 + 0xc;
      goto LAB_0012671d;
    case 0xc5:
      lVar12 = 0;
      do {
        iVar6 = getNum(pcVar3 + ctl->eaten,&local_74,(int8_t *)&local_78);
        if (((char)local_78 != '\x01') || (0xff < local_74)) goto LAB_00126719;
        *(char *)((long)local_60 + lVar12) = (char)local_74;
        lVar12 = lVar12 + 1;
        ctl->eaten = ctl->eaten + iVar6;
      } while ((int)lVar12 != 0x200);
      lVar12 = 0x200;
LAB_00126719:
      uVar7 = (uint32_t)lVar12;
      p[3] = uVar7;
LAB_0012671d:
      bVar16 = uVar7 == 0;
    default:
      goto switchD_0012595a_caseD_66;
    }
  }
  bVar16 = false;
switchD_0012595a_caseD_66:
  if (bVar16 != false) {
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

int cmdParse(
   char *buf, uint32_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uint32_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}